

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-whisper.cpp
# Opt level: O0

bool read_audio_data(string *fname,vector<float,_std::allocator<float>_> *pcmf32,
                    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *pcmf32s,bool stereo)

{
  const_iterator __position;
  bool bVar1;
  size_t sVar2;
  size_type sVar3;
  char *pcVar4;
  reference pvVar5;
  reference pvVar6;
  byte in_CL;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  uint64_t i;
  ma_uint64 frames_read;
  ma_uint64 frame_count;
  size_t n;
  uint8_t buf [1024];
  ma_decoder decoder;
  ma_decoder_config decoder_config;
  ma_result result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> audio_data;
  ma_decoder *in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff780;
  value_type vVar7;
  undefined4 in_stack_fffffffffffff784;
  undefined4 in_stack_fffffffffffff790;
  ma_result in_stack_fffffffffffff794;
  ma_decoder *in_stack_fffffffffffff798;
  vector<float,_std::allocator<float>_> *this;
  undefined4 in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b4;
  uchar *in_stack_fffffffffffff7b8;
  FILE *pFVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7cc;
  size_type local_7e8;
  ulong local_7d8;
  undefined1 local_7a8 [64];
  ma_decoder *in_stack_fffffffffffff898;
  ma_decoder *in_stack_fffffffffffff8a0;
  ma_decoder_config *in_stack_fffffffffffff8a8;
  size_t in_stack_fffffffffffff8b0;
  void *in_stack_fffffffffffff8b8;
  undefined1 local_390 [696];
  undefined1 local_d8 [148];
  ma_result local_44;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  byte local_21;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_20;
  vector<float,_std::allocator<float>_> *local_18;
  byte local_1;
  
  local_21 = in_CL & 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x25a477);
  ma_decoder_config_init
            ((ma_format)((ulong)in_stack_fffffffffffff7c0 >> 0x20),
             (ma_uint32)in_stack_fffffffffffff7c0,
             (ma_uint32)((ulong)in_stack_fffffffffffff7b8 >> 0x20));
  memcpy(local_d8,local_390,0x90);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                          (char *)in_stack_fffffffffffff778);
  if (bVar1) {
    while (sVar2 = fread(local_7a8,1,0x400,_stdin), sVar2 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff778)
      ;
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffff778);
      __position._M_current._4_4_ = in_stack_fffffffffffff7cc;
      __position._M_current._0_4_ = in_stack_fffffffffffff7c8;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
                (in_stack_fffffffffffff7c0,__position,in_stack_fffffffffffff7b8,
                 (uchar *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x25a5e9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_40);
    local_44 = ma_decoder_init_memory
                         (in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
                          in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    pFVar8 = _stderr;
    if (local_44 != MA_SUCCESS) {
      pcVar4 = ma_result_description(local_44);
      fprintf(pFVar8,"Error: failed to open audio data from stdin (%s)\n",pcVar4);
      local_1 = 0;
      goto LAB_0025aa3e;
    }
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_40);
    fprintf(pFVar8,"%s: read %zu bytes from stdin\n","read_audio_data",sVar3);
  }
  else {
    std::__cxx11::string::c_str();
    local_44 = ma_decoder_init_file
                         ((char *)in_stack_fffffffffffff8a8,
                          (ma_decoder_config *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
    if (local_44 != MA_SUCCESS) {
      std::__cxx11::string::c_str();
      std::__cxx11::string::size();
      local_44 = ma_decoder_init_memory
                           (in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
                            in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
      if (local_44 != MA_SUCCESS) {
        pFVar8 = _stderr;
        pcVar4 = ma_result_description(local_44);
        fprintf(pFVar8,"error: failed to read audio data as wav (%s)\n",pcVar4);
        local_1 = 0;
        goto LAB_0025aa3e;
      }
      local_44 = MA_SUCCESS;
    }
  }
  local_44 = ma_decoder_get_length_in_pcm_frames
                       (in_stack_fffffffffffff798,
                        (ma_uint64 *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
  pFVar8 = _stderr;
  if (local_44 == MA_SUCCESS) {
    sVar3 = local_7d8;
    if ((local_21 & 1) != 0) {
      sVar3 = local_7d8 << 1;
    }
    this = local_18;
    std::vector<float,_std::allocator<float>_>::resize(local_18,sVar3);
    std::vector<float,_std::allocator<float>_>::data
              ((vector<float,_std::allocator<float>_> *)0x25a858);
    in_stack_fffffffffffff794 =
         ma_decoder_read_pcm_frames
                   ((ma_decoder *)decoder_config._112_8_,decoder_config.allocationCallbacks.onFree,
                    (ma_uint64)decoder_config.allocationCallbacks.onRealloc,
                    (ma_uint64 *)decoder_config.allocationCallbacks.onMalloc);
    pFVar8 = _stderr;
    local_44 = in_stack_fffffffffffff794;
    if (in_stack_fffffffffffff794 == MA_SUCCESS) {
      if ((local_21 & 1) != 0) {
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *)this,sVar3);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::operator[](local_20,0);
        std::vector<float,_std::allocator<float>_>::resize(this,sVar3);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::operator[](local_20,1);
        std::vector<float,_std::allocator<float>_>::resize(this,sVar3);
        for (local_7e8 = 0; local_7e8 < local_7d8; local_7e8 = local_7e8 + 1) {
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](local_18,local_7e8 << 1);
          vVar7 = *pvVar5;
          pvVar6 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](local_20,0);
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar6,local_7e8);
          *pvVar5 = vVar7;
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             (local_18,local_7e8 * 2 + 1);
          vVar7 = *pvVar5;
          pvVar6 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](local_20,1);
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar6,local_7e8);
          *pvVar5 = vVar7;
        }
      }
      ma_decoder_uninit(in_stack_fffffffffffff778);
      local_1 = 1;
    }
    else {
      pcVar4 = ma_result_description(in_stack_fffffffffffff794);
      fprintf(pFVar8,"error: failed to read the frames of the audio data (%s)\n",pcVar4);
      local_1 = 0;
    }
  }
  else {
    pcVar4 = ma_result_description(local_44);
    fprintf(pFVar8,"error: failed to retrieve the length of the audio data (%s)\n",pcVar4);
    local_1 = 0;
  }
LAB_0025aa3e:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
  return (bool)(local_1 & 1);
}

Assistant:

bool read_audio_data(const std::string & fname, std::vector<float>& pcmf32, std::vector<std::vector<float>>& pcmf32s, bool stereo) {
    std::vector<uint8_t> audio_data; // used for pipe input from stdin or ffmpeg decoding output

    ma_result result;
    ma_decoder_config decoder_config;
    ma_decoder decoder;

    decoder_config = ma_decoder_config_init(ma_format_f32, stereo ? 2 : 1, WHISPER_SAMPLE_RATE);

    if (fname == "-") {
		#ifdef _WIN32
		_setmode(_fileno(stdin), _O_BINARY);
		#endif

		uint8_t buf[1024];
		while (true)
		{
			const size_t n = fread(buf, 1, sizeof(buf), stdin);
			if (n == 0) {
				break;
			}
			audio_data.insert(audio_data.end(), buf, buf + n);
		}

		if ((result = ma_decoder_init_memory(audio_data.data(), audio_data.size(), &decoder_config, &decoder)) != MA_SUCCESS) {

			fprintf(stderr, "Error: failed to open audio data from stdin (%s)\n", ma_result_description(result));

			return false;
		}

		fprintf(stderr, "%s: read %zu bytes from stdin\n", __func__, audio_data.size());
    }
    else if (((result = ma_decoder_init_file(fname.c_str(), &decoder_config, &decoder)) != MA_SUCCESS)) {
#if defined(WHISPER_FFMPEG)
		if (ffmpeg_decode_audio(fname, audio_data) != 0) {
			fprintf(stderr, "error: failed to ffmpeg decode '%s'\n", fname.c_str());

			return false;
		}

		if ((result = ma_decoder_init_memory(audio_data.data(), audio_data.size(), &decoder_config, &decoder)) != MA_SUCCESS) {
			fprintf(stderr, "error: failed to read audio data as wav (%s)\n", ma_result_description(result));

			return false;
		}
#else
		if ((result = ma_decoder_init_memory(fname.c_str(), fname.size(), &decoder_config, &decoder)) != MA_SUCCESS) {
			fprintf(stderr, "error: failed to read audio data as wav (%s)\n", ma_result_description(result));

			return false;
		}
#endif
    }

    ma_uint64 frame_count;
    ma_uint64 frames_read;

    if ((result = ma_decoder_get_length_in_pcm_frames(&decoder, &frame_count)) != MA_SUCCESS) {
		fprintf(stderr, "error: failed to retrieve the length of the audio data (%s)\n", ma_result_description(result));

		return false;
    }

    pcmf32.resize(stereo ? frame_count*2 : frame_count);

    if ((result = ma_decoder_read_pcm_frames(&decoder, pcmf32.data(), frame_count, &frames_read)) != MA_SUCCESS) {
		fprintf(stderr, "error: failed to read the frames of the audio data (%s)\n", ma_result_description(result));

		return false;
    }

    if (stereo) {
		pcmf32s.resize(2);
		pcmf32s[0].resize(frame_count);
		pcmf32s[1].resize(frame_count);
		for (uint64_t i = 0; i < frame_count; i++) {
			pcmf32s[0][i] = pcmf32[2*i];
			pcmf32s[1][i] = pcmf32[2*i + 1];
		}
    }

    ma_decoder_uninit(&decoder);

    return true;
}